

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsString(AMFImporter *this,string *pValue)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  runtime_error *prVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 == '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"XML_ReadNode_GetVal_AsString. No data, seems file is corrupt.",""
              );
    std::runtime_error::runtime_error(prVar3,(string *)local_40);
    *(undefined ***)prVar3 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar2 == 3) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
    pcVar1 = (char *)pValue->_M_string_length;
    strlen((char *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::_M_replace((ulong)pValue,0,pcVar1,CONCAT44(extraout_var,iVar2));
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "XML_ReadNode_GetVal_AsString. Invalid type of XML element, seems file is corrupt.","")
  ;
  std::runtime_error::runtime_error(prVar3,(string *)local_40);
  *(undefined ***)prVar3 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::XML_ReadNode_GetVal_AsString(std::string& pValue)
{
	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsString. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT)
		throw DeadlyImportError("XML_ReadNode_GetVal_AsString. Invalid type of XML element, seems file is corrupt.");

	pValue = mReader->getNodeData();
}